

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hh
# Opt level: O1

void __thiscall EnvDecl::EnvDecl(EnvDecl *this,string *n,string *s)

{
  pointer pcVar1;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (n->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + n->_M_string_length);
  (this->source)._M_dataplus._M_p = (pointer)&(this->source).field_2;
  pcVar1 = (s->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->source,pcVar1,pcVar1 + s->_M_string_length);
  return;
}

Assistant:

EnvDecl(std::string n, std::string s)
        : name(n)
        , source(s)
    {
    }